

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MaxDistanceCellTarget::UpdateMinDistance
          (S2MaxDistanceCellTarget *this,S2Point *p,S2MaxDistance *min_dist)

{
  bool bVar1;
  S1ChordAngle x;
  S2MaxDistance local_28;
  S2MaxDistance *local_20;
  S2MaxDistance *min_dist_local;
  S2Point *p_local;
  S2MaxDistanceCellTarget *this_local;
  
  local_20 = min_dist;
  min_dist_local = (S2MaxDistance *)p;
  p_local = (S2Point *)this;
  x = S2Cell::GetMaxDistance(&this->cell_,p);
  S2MaxDistance::S2MaxDistance(&local_28,x);
  bVar1 = S2MaxDistance::UpdateMin(min_dist,&local_28);
  return bVar1;
}

Assistant:

bool S2MaxDistanceCellTarget::UpdateMinDistance(
    const S2Point& p, S2MaxDistance* min_dist) {
  return min_dist->UpdateMin(S2MaxDistance(cell_.GetMaxDistance(p)));
}